

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O2

void __thiscall Am_float::TypeError(Am_float *this,Am_Value *in_value)

{
  Am_Error();
}

Assistant:

Am_Define_Pointer_Wrapper_Impl(float, (0L));

void
test_int(float id, int result, int expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      cout << "Test " << test_counter << endl;
  } else
    cout << id << "     ";

  if (result == expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << ", result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
}